

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COMBICState.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::COMBICState::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,COMBICState *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  EnvironmentRecord::GetAsString_abi_cxx11_(&local_1c0,&this->super_EnvironmentRecord);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tTime Since Creation:       ",0x1c);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tMunition Source:           ",0x1c);
  EntityType::GetAsString_abi_cxx11_(&local_1e0,&this->m_MunSrc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tNumber Of Sources:         ",0x1c);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tGeometry Index:            ",0x1c);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tSource Type:               ",0x1c);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tBarrage Rate:              ",0x1c);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32BarrageRate);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tBarrage Duration:          ",0x1c);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32BarrageDuration);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tBarrage Crosswind Length:  ",0x1c);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32BarrageCrosswindLength);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tBarrage Downwind Length:   ",0x1c);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32BarrageDownwindLength);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tDetonation Velocity:       ",0x1c);
  EulerAngles::GetAsString_abi_cxx11_(&local_200,&this->m_DetVel);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_200._M_dataplus._M_p,local_200._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString COMBICState::GetAsString() const
{
    KStringStream ss;

    ss << EnvironmentRecord::GetAsString()
       << "\tTime Since Creation:       " << m_ui32TSC                   << "\n"
       << "\tMunition Source:           " << m_MunSrc.GetAsString()
       << "\tNumber Of Sources:         " << m_ui32NumSrcs               << "\n"
       << "\tGeometry Index:            " << m_ui16GeometryIndex         << "\n"
       << "\tSource Type:               " << m_ui32SrcType               << "\n"
       << "\tBarrage Rate:              " << m_f32BarrageRate            << "\n"
       << "\tBarrage Duration:          " << m_f32BarrageDuration        << "\n"
       << "\tBarrage Crosswind Length:  " << m_f32BarrageCrosswindLength << "\n"
       << "\tBarrage Downwind Length:   " << m_f32BarrageDownwindLength  << "\n"
       << "\tDetonation Velocity:       " << m_DetVel.GetAsString();

    return ss.str();
}